

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lattice.cpp
# Opt level: O2

void __thiscall
OpenMD::Lattice::getLatticePointsPos
          (Lattice *this,
          vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *latticePos,
          int nx,int ny,int nz)

{
  int iVar1;
  pointer pVVar2;
  pointer pVVar3;
  long lVar4;
  long lVar5;
  
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
            (latticePos,(long)this->nCellSites);
  iVar1 = this->nCellSites;
  pVVar2 = (this->cellSitesPos).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (latticePos->
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar4 = 0x10;
  for (lVar5 = 0; lVar5 < iVar1; lVar5 = lVar5 + 1) {
    *(double *)((long)(pVVar3->super_Vector<double,_3U>).data_ + lVar4 + -0x10) =
         (this->cellLen).super_Vector<double,_3U>.data_[0] * ((double)nx + -0.5) +
         (this->origin).super_Vector<double,_3U>.data_[0] +
         *(double *)((long)(pVVar2->super_Vector<double,_3U>).data_ + lVar4 + -0x10);
    *(double *)((long)(pVVar3->super_Vector<double,_3U>).data_ + lVar4 + -8) =
         (this->cellLen).super_Vector<double,_3U>.data_[1] * ((double)ny + -0.5) +
         (this->origin).super_Vector<double,_3U>.data_[1] +
         *(double *)((long)(pVVar2->super_Vector<double,_3U>).data_ + lVar4 + -8);
    *(double *)((long)(pVVar3->super_Vector<double,_3U>).data_ + lVar4) =
         (this->cellLen).super_Vector<double,_3U>.data_[2] * ((double)nz + -0.5) +
         (this->origin).super_Vector<double,_3U>.data_[2] +
         *(double *)((long)(pVVar2->super_Vector<double,_3U>).data_ + lVar4);
    lVar4 = lVar4 + 0x18;
  }
  return;
}

Assistant:

void Lattice::getLatticePointsPos(std::vector<Vector3d>& latticePos, int nx,
                                    int ny, int nz) {
    latticePos.resize(nCellSites);

    for (int i = 0; i < nCellSites; i++) {
      latticePos[i][0] =
          origin[0] + cellSitesPos[i][0] + cellLen[0] * (RealType(nx) - 0.5);
      latticePos[i][1] =
          origin[1] + cellSitesPos[i][1] + cellLen[1] * (RealType(ny) - 0.5);
      latticePos[i][2] =
          origin[2] + cellSitesPos[i][2] + cellLen[2] * (RealType(nz) - 0.5);
    }
  }